

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_get_table(sqlite3 *db,char *zSql,char ***pazResult,int *pnRow,int *pnColumn,
                     char **pzErrMsg)

{
  char *pcVar1;
  ulong *puVar2;
  undefined4 *in_RCX;
  sqlite3_callback in_RDX;
  char *in_RSI;
  sqlite3 *in_RDI;
  char **in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  char **azNew;
  int rc;
  TabResult res;
  sqlite3_uint64 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff90;
  uint local_34;
  ulong *local_30;
  long local_28;
  uint local_20;
  undefined4 local_1c;
  undefined4 local_18;
  uint local_14;
  uint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_30,0xaa,0x28);
  *(undefined8 *)in_RDX = 0;
  if (in_R8 != (char **)0x0) {
    *(undefined4 *)in_R8 = 0;
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R9 != (undefined8 *)0x0) {
    *in_R9 = 0;
  }
  local_28 = 0;
  local_1c = 0;
  local_18 = 0;
  local_14 = 1;
  local_20 = 0x14;
  local_10 = 0;
  local_30 = (ulong *)sqlite3_malloc64(in_stack_ffffffffffffff78);
  if (local_30 == (ulong *)0x0) {
    in_RDI->errCode = 7;
    local_34 = 7;
  }
  else {
    *local_30 = 0;
    local_34 = sqlite3_exec(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
    *local_30 = (ulong)local_14;
    if ((local_34 & 0xff) == 4) {
      sqlite3_free_table((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (local_28 != 0) {
        if (in_R9 != (undefined8 *)0x0) {
          sqlite3_free((void *)0x146759);
          pcVar1 = sqlite3_mprintf("%s",local_28);
          *in_R9 = pcVar1;
        }
        sqlite3_free((void *)0x146781);
      }
      in_RDI->errCode = local_10;
      local_34 = local_10;
    }
    else {
      sqlite3_free((void *)0x1467a4);
      if (local_34 == 0) {
        puVar2 = local_30;
        if ((local_14 < local_20) &&
           (puVar2 = (ulong *)sqlite3Realloc(in_R9,(ulong)in_stack_ffffffffffffff90),
           puVar2 == (ulong *)0x0)) {
          sqlite3_free_table((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
          ;
          in_RDI->errCode = 7;
          local_34 = 7;
        }
        else {
          local_30 = puVar2;
          *(ulong **)in_RDX = local_30 + 1;
          if (in_R8 != (char **)0x0) {
            *(undefined4 *)in_R8 = local_18;
          }
          if (in_RCX != (undefined4 *)0x0) {
            *in_RCX = local_1c;
          }
        }
      }
      else {
        sqlite3_free_table((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

SQLITE_API int sqlite3_get_table(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  char ***pazResult,          /* Write the result table here */
  int *pnRow,                 /* Write the number of rows in the result here */
  int *pnColumn,              /* Write the number of columns of result here */
  char **pzErrMsg             /* Write error messages here */
){
  int rc;
  TabResult res;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pazResult==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *pazResult = 0;
  if( pnColumn ) *pnColumn = 0;
  if( pnRow ) *pnRow = 0;
  if( pzErrMsg ) *pzErrMsg = 0;
  res.zErrMsg = 0;
  res.nRow = 0;
  res.nColumn = 0;
  res.nData = 1;
  res.nAlloc = 20;
  res.rc = SQLITE_OK;
  res.azResult = sqlite3_malloc64(sizeof(char*)*res.nAlloc );
  if( res.azResult==0 ){
     db->errCode = SQLITE_NOMEM;
     return SQLITE_NOMEM_BKPT;
  }
  res.azResult[0] = 0;
  rc = sqlite3_exec(db, zSql, sqlite3_get_table_cb, &res, pzErrMsg);
  assert( sizeof(res.azResult[0])>= sizeof(res.nData) );
  res.azResult[0] = SQLITE_INT_TO_PTR(res.nData);
  if( (rc&0xff)==SQLITE_ABORT ){
    sqlite3_free_table(&res.azResult[1]);
    if( res.zErrMsg ){
      if( pzErrMsg ){
        sqlite3_free(*pzErrMsg);
        *pzErrMsg = sqlite3_mprintf("%s",res.zErrMsg);
      }
      sqlite3_free(res.zErrMsg);
    }
    db->errCode = res.rc;  /* Assume 32-bit assignment is atomic */
    return res.rc;
  }
  sqlite3_free(res.zErrMsg);
  if( rc!=SQLITE_OK ){
    sqlite3_free_table(&res.azResult[1]);
    return rc;
  }
  if( res.nAlloc>res.nData ){
    char **azNew;
    azNew = sqlite3Realloc( res.azResult, sizeof(char*)*res.nData );
    if( azNew==0 ){
      sqlite3_free_table(&res.azResult[1]);
      db->errCode = SQLITE_NOMEM;
      return SQLITE_NOMEM_BKPT;
    }
    res.azResult = azNew;
  }
  *pazResult = &res.azResult[1];
  if( pnColumn ) *pnColumn = res.nColumn;
  if( pnRow ) *pnRow = res.nRow;
  return rc;
}